

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

Pubkey * __thiscall
cfd::core::Privkey::GeneratePubkey(Pubkey *__return_storage_ptr__,Privkey *this,bool is_compressed)

{
  _Alloc_hider priv_key;
  value_type_conflict *__val;
  size_t priv_key_len;
  CfdException *pCVar1;
  int ret;
  int local_d4;
  string local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  undefined1 local_98 [16];
  uchar *local_88;
  ByteData local_80;
  ByteData local_68;
  CfdSourceLocation local_50;
  ByteData local_38;
  
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x21);
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x21;
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,&this->data_
                    );
  priv_key._M_p = local_d0._M_dataplus._M_p;
  priv_key_len = ByteData::GetDataSize(&this->data_);
  local_d4 = wally_ec_public_key_from_private_key
                       ((uchar *)priv_key._M_p,priv_key_len,
                        local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if ((uchar *)local_d0._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_d4 != 0) {
    local_98._0_8_ = "cfdcore_key.cpp";
    local_98._8_4_ = 0x18a;
    local_88 = "GeneratePubkey";
    ByteData::GetHex_abi_cxx11_(&local_d0,&this->data_);
    logger::log<int&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
               "wally_ec_public_key_from_private_key error. ret={} privkey={}.",&local_d4,&local_d0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Generate Pubkey error.","");
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_d0);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_compressed) {
    ByteData::ByteData(&local_38,&local_b0);
    Pubkey::Pubkey(__return_storage_ptr__,&local_38);
  }
  else {
    local_98._0_8_ = operator_new(0x41);
    local_98._8_8_ = local_98._0_8_ + 0x41;
    *(uchar *)(local_98._0_8_ + 0x30) = '\0';
    *(uchar *)(local_98._0_8_ + 0x31) = '\0';
    *(uchar *)(local_98._0_8_ + 0x32) = '\0';
    *(uchar *)(local_98._0_8_ + 0x33) = '\0';
    *(uchar *)(local_98._0_8_ + 0x34) = '\0';
    *(uchar *)(local_98._0_8_ + 0x35) = '\0';
    *(uchar *)(local_98._0_8_ + 0x36) = '\0';
    *(uchar *)(local_98._0_8_ + 0x37) = '\0';
    *(uchar *)(local_98._0_8_ + 0x38) = '\0';
    *(uchar *)(local_98._0_8_ + 0x39) = '\0';
    *(uchar *)(local_98._0_8_ + 0x3a) = '\0';
    *(uchar *)(local_98._0_8_ + 0x3b) = '\0';
    *(uchar *)(local_98._0_8_ + 0x3c) = '\0';
    *(uchar *)(local_98._0_8_ + 0x3d) = '\0';
    *(uchar *)(local_98._0_8_ + 0x3e) = '\0';
    *(uchar *)(local_98._0_8_ + 0x3f) = '\0';
    *(uchar *)(local_98._0_8_ + 0x20) = '\0';
    *(uchar *)(local_98._0_8_ + 0x21) = '\0';
    *(uchar *)(local_98._0_8_ + 0x22) = '\0';
    *(uchar *)(local_98._0_8_ + 0x23) = '\0';
    *(uchar *)(local_98._0_8_ + 0x24) = '\0';
    *(uchar *)(local_98._0_8_ + 0x25) = '\0';
    *(uchar *)(local_98._0_8_ + 0x26) = '\0';
    *(uchar *)(local_98._0_8_ + 0x27) = '\0';
    *(uchar *)(local_98._0_8_ + 0x28) = '\0';
    *(uchar *)(local_98._0_8_ + 0x29) = '\0';
    *(uchar *)(local_98._0_8_ + 0x2a) = '\0';
    *(uchar *)(local_98._0_8_ + 0x2b) = '\0';
    *(uchar *)(local_98._0_8_ + 0x2c) = '\0';
    *(uchar *)(local_98._0_8_ + 0x2d) = '\0';
    *(uchar *)(local_98._0_8_ + 0x2e) = '\0';
    *(uchar *)(local_98._0_8_ + 0x2f) = '\0';
    *(uchar *)(local_98._0_8_ + 0x10) = '\0';
    *(uchar *)(local_98._0_8_ + 0x11) = '\0';
    *(uchar *)(local_98._0_8_ + 0x12) = '\0';
    *(uchar *)(local_98._0_8_ + 0x13) = '\0';
    *(uchar *)(local_98._0_8_ + 0x14) = '\0';
    *(uchar *)(local_98._0_8_ + 0x15) = '\0';
    *(uchar *)(local_98._0_8_ + 0x16) = '\0';
    *(uchar *)(local_98._0_8_ + 0x17) = '\0';
    *(uchar *)(local_98._0_8_ + 0x18) = '\0';
    *(uchar *)(local_98._0_8_ + 0x19) = '\0';
    *(uchar *)(local_98._0_8_ + 0x1a) = '\0';
    *(uchar *)(local_98._0_8_ + 0x1b) = '\0';
    *(uchar *)(local_98._0_8_ + 0x1c) = '\0';
    *(uchar *)(local_98._0_8_ + 0x1d) = '\0';
    *(uchar *)(local_98._0_8_ + 0x1e) = '\0';
    *(uchar *)(local_98._0_8_ + 0x1f) = '\0';
    *(uchar *)(local_98._0_8_ + 0) = '\0';
    *(uchar *)(local_98._0_8_ + 1) = '\0';
    *(uchar *)(local_98._0_8_ + 2) = '\0';
    *(uchar *)(local_98._0_8_ + 3) = '\0';
    *(uchar *)(local_98._0_8_ + 4) = '\0';
    *(uchar *)(local_98._0_8_ + 5) = '\0';
    *(uchar *)(local_98._0_8_ + 6) = '\0';
    *(uchar *)(local_98._0_8_ + 7) = '\0';
    *(uchar *)(local_98._0_8_ + 8) = '\0';
    *(uchar *)(local_98._0_8_ + 9) = '\0';
    *(uchar *)(local_98._0_8_ + 10) = '\0';
    *(uchar *)(local_98._0_8_ + 0xb) = '\0';
    *(uchar *)(local_98._0_8_ + 0xc) = '\0';
    *(uchar *)(local_98._0_8_ + 0xd) = '\0';
    *(uchar *)(local_98._0_8_ + 0xe) = '\0';
    *(uchar *)(local_98._0_8_ + 0xf) = '\0';
    *(uchar *)(local_98._0_8_ + 0x40) = '\0';
    local_88 = (uchar *)local_98._8_8_;
    local_d4 = wally_ec_public_key_decompress
                         (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(uchar *)local_98._0_8_,
                          0x41);
    if (local_d4 != 0) {
      local_50.filename = "cfdcore_key.cpp";
      local_50.line = 0x19a;
      local_50.funcname = "GeneratePubkey";
      ByteData::ByteData(&local_68,&local_b0);
      ByteData::GetHex_abi_cxx11_(&local_d0,&local_68);
      logger::log<int&,std::__cxx11::string&>
                (&local_50,kCfdLogLevelWarning,
                 "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",&local_d4,
                 &local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Decompressed Pubkey error.","");
      CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_d0);
      __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(&local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    Pubkey::Pubkey(__return_storage_ptr__,&local_80);
    local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    }
  }
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Privkey::GeneratePubkey(bool is_compressed) const {
  std::vector<uint8_t> pubkey(Pubkey::kCompressedPubkeySize);
  int ret = wally_ec_public_key_from_private_key(
      data_.GetBytes().data(), data_.GetDataSize(), pubkey.data(),
      pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_from_private_key error. ret={} privkey={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Generate Pubkey error.");
  }
  if (is_compressed) {
    return Pubkey(pubkey);
  }

  std::vector<uint8_t> uncompressed_pubkey(Pubkey::kPubkeySize);
  ret = wally_ec_public_key_decompress(
      pubkey.data(), pubkey.size(), uncompressed_pubkey.data(),
      uncompressed_pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
        ret, ByteData(pubkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Decompressed Pubkey error.");
  }
  return Pubkey(uncompressed_pubkey);
}